

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  stbi_uc sVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  stbi_uc *psVar11;
  long lVar12;
  int req_comp_00;
  int iVar13;
  stbi_uc *psVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  stbi_uc *psVar20;
  byte bVar21;
  uint uVar22;
  float *output_00;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  char cStack_4c8;
  char cStack_4c7;
  char cStack_4c6;
  char cStack_4c5;
  char cStack_4c4;
  char cStack_4c3;
  char cStack_4c2;
  char cStack_4c1;
  char buffer [1024];
  stbi_uc local_c0 [4];
  byte local_bc;
  byte local_bb;
  byte local_ba;
  stbi_uc local_b9;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  float *local_68;
  stbi_uc *local_50;
  
  stbi__hdr_gettoken(s,&cStack_4c8);
  if (CONCAT17(buffer[2],
               CONCAT16(buffer[1],
                        CONCAT15(buffer[0],
                                 CONCAT14(cStack_4c1,
                                          CONCAT13(cStack_4c2,
                                                   CONCAT12(cStack_4c3,
                                                            CONCAT11(cStack_4c4,cStack_4c5))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_4c1,
               CONCAT16(cStack_4c2,
                        CONCAT15(cStack_4c3,
                                 CONCAT14(cStack_4c4,
                                          CONCAT13(cStack_4c5,
                                                   CONCAT12(cStack_4c6,
                                                            CONCAT11(cStack_4c7,cStack_4c8))))))) ==
      0x4e41494441523f23) {
    stbi__hdr_gettoken(s,&cStack_4c8);
    if (cStack_4c8 != '\0') {
      bVar4 = false;
      do {
        auVar24[0] = -(cStack_4c1 == '3');
        auVar24[1] = -(buffer[0] == '2');
        auVar24[2] = -(buffer[1] == '-');
        auVar24[3] = -(buffer[2] == 'b');
        auVar24[4] = -(buffer[3] == 'i');
        auVar24[5] = -(buffer[4] == 't');
        auVar24[6] = -(buffer[5] == '_');
        auVar24[7] = -(buffer[6] == 'r');
        auVar24[8] = -(buffer[7] == 'l');
        auVar24[9] = -(buffer[8] == 'e');
        auVar24[10] = -(buffer[9] == '_');
        auVar24[0xb] = -(buffer[10] == 'r');
        auVar24[0xc] = -(buffer[0xb] == 'g');
        auVar24[0xd] = -(buffer[0xc] == 'b');
        auVar24[0xe] = -(buffer[0xd] == 'e');
        auVar24[0xf] = -(buffer[0xe] == '\0');
        auVar25[0] = -(cStack_4c8 == 'F');
        auVar25[1] = -(cStack_4c7 == 'O');
        auVar25[2] = -(cStack_4c6 == 'R');
        auVar25[3] = -(cStack_4c5 == 'M');
        auVar25[4] = -(cStack_4c4 == 'A');
        auVar25[5] = -(cStack_4c3 == 'T');
        auVar25[6] = -(cStack_4c2 == '=');
        auVar25[7] = -(cStack_4c1 == '3');
        auVar25[8] = -(buffer[0] == '2');
        auVar25[9] = -(buffer[1] == '-');
        auVar25[10] = -(buffer[2] == 'b');
        auVar25[0xb] = -(buffer[3] == 'i');
        auVar25[0xc] = -(buffer[4] == 't');
        auVar25[0xd] = -(buffer[5] == '_');
        auVar25[0xe] = -(buffer[6] == 'r');
        auVar25[0xf] = -(buffer[7] == 'l');
        auVar25 = auVar25 & auVar24;
        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
          bVar4 = true;
        }
        stbi__hdr_gettoken(s,&cStack_4c8);
      } while (cStack_4c8 != '\0');
      if (bVar4) {
        stbi__hdr_gettoken(s,&cStack_4c8);
        if (cStack_4c6 == ' ' && CONCAT11(cStack_4c7,cStack_4c8) == 0x592d) {
          _rgbe_1 = &cStack_4c5;
          uVar9 = strtol(_rgbe_1,(char **)rgbe_1,10);
          _rgbe_1 = _rgbe_1 + 2;
          do {
            pcVar16 = _rgbe_1;
            _rgbe_1 = pcVar16 + 1;
          } while (pcVar16[-2] == ' ');
          if (((pcVar16[-2] == '+') && (pcVar16[-1] == 'X')) && (*pcVar16 == ' ')) {
            iVar13 = 0;
            uVar10 = strtol(_rgbe_1,(char **)0x0,10);
            uVar7 = (uint)uVar10;
            *x = uVar7;
            iVar19 = (int)uVar9;
            *y = iVar19;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            req_comp_00 = 3;
            if (req_comp != 0) {
              req_comp_00 = req_comp;
            }
            output = (float *)malloc((long)(int)(iVar19 * uVar7 * req_comp_00) << 2);
            if (uVar7 - 0x8000 < 0xffff8008) goto LAB_0011d20d;
            if (iVar19 < 1) {
              local_50 = (stbi_uc *)0x0;
            }
            else {
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              uVar23 = 0;
              local_50 = (stbi_uc *)0x0;
              local_68 = output;
              do {
                psVar20 = s->img_buffer;
                psVar11 = s->img_buffer_end;
                if (psVar20 < psVar11) {
                  s->img_buffer = psVar20 + 1;
                  bVar5 = *psVar20;
                  psVar20 = psVar20 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar5 = 0;
                }
                else {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar5 = 0;
                    psVar11 = psVar2;
                  }
                  else {
                    bVar5 = *psVar1;
                    psVar11 = psVar1 + iVar13;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar2;
                  psVar20 = psVar2;
                }
                if (psVar20 < psVar11) {
                  s->img_buffer = psVar20 + 1;
                  bVar18 = *psVar20;
                  psVar20 = psVar20 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar18 = 0;
                }
                else {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar18 = 0;
                    psVar11 = psVar2;
                  }
                  else {
                    bVar18 = *psVar1;
                    psVar11 = psVar1 + iVar13;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar2;
                  psVar20 = psVar2;
                }
                if (psVar20 < psVar11) {
                  s->img_buffer = psVar20 + 1;
                  bVar21 = *psVar20;
                  psVar20 = psVar20 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar21 = 0;
                }
                else {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar21 = 0;
                    psVar11 = psVar2;
                  }
                  else {
                    bVar21 = *psVar1;
                    psVar11 = psVar1 + iVar13;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar2;
                  psVar20 = psVar2;
                }
                if (((bVar5 != 2) || (bVar18 != 2)) || ((char)bVar21 < '\0')) {
                  local_bc = bVar5;
                  local_bb = bVar18;
                  local_ba = bVar21;
                  local_b9 = stbi__get8(s);
                  stbi__hdr_convert(output,&local_bc,req_comp_00);
                  free(local_50);
                  iVar13 = 0;
                  iVar8 = 1;
                  do {
                    stbi__getn(s,local_c0,4);
                    stbi__hdr_convert(output + (long)(int)(req_comp_00 * uVar7 * iVar13) +
                                               (long)(iVar8 * req_comp_00),local_c0,req_comp_00);
                    iVar8 = iVar8 + 1;
                    while ((int)uVar7 <= iVar8) {
                      iVar13 = iVar13 + 1;
LAB_0011d20d:
                      iVar8 = 0;
                      if (iVar19 <= iVar13) {
                        return output;
                      }
                    }
                  } while( true );
                }
                if (psVar20 < psVar11) {
                  s->img_buffer = psVar20 + 1;
                  bVar5 = *psVar20;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar5 = 0;
                }
                else {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar5 = 0;
                    psVar20 = psVar2;
                  }
                  else {
                    bVar5 = *psVar1;
                    psVar20 = psVar1 + iVar13;
                  }
                  s->img_buffer_end = psVar20;
                  s->img_buffer = psVar2;
                }
                if (CONCAT11(bVar21,bVar5) != uVar7) {
                  free(output);
                  free(local_50);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if (local_50 == (stbi_uc *)0x0) {
                  local_50 = (stbi_uc *)malloc((ulong)(uVar7 * 4));
                }
                lVar12 = 0;
                psVar20 = local_50;
                do {
                  iVar13 = 0;
                  do {
                    pbVar3 = s->img_buffer;
                    psVar11 = s->img_buffer_end;
                    if (pbVar3 < psVar11) {
                      s->img_buffer = pbVar3 + 1;
                      uVar22 = (uint)*pbVar3;
                      psVar14 = pbVar3 + 1;
LAB_0011cfae:
                      if ((byte)uVar22 < 0x81) {
                        if ((byte)uVar22 != 0) {
                          lVar15 = 0;
                          do {
                            psVar11 = s->img_buffer;
                            if (psVar11 < s->img_buffer_end) {
                              s->img_buffer = psVar11 + 1;
                              sVar6 = *psVar11;
                            }
                            else if (s->read_from_callbacks == 0) {
                              sVar6 = '\0';
                            }
                            else {
                              iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              if (iVar8 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                sVar6 = '\0';
                                psVar11 = psVar2;
                              }
                              else {
                                sVar6 = *psVar1;
                                psVar11 = psVar1 + iVar8;
                              }
                              s->img_buffer_end = psVar11;
                              s->img_buffer = psVar2;
                            }
                            psVar20[lVar15 * 4 + (long)iVar13 * 4] = sVar6;
                            lVar15 = lVar15 + 1;
                          } while (uVar22 != (uint)lVar15);
                          iVar13 = iVar13 + (uint)lVar15;
                        }
                      }
                      else {
                        if (psVar14 < psVar11) {
                          s->img_buffer = psVar14 + 1;
                          bVar5 = *psVar14;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar5 = 0;
                        }
                        else {
                          iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar8 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar5 = 0;
                            psVar11 = psVar2;
                          }
                          else {
                            bVar5 = *psVar1;
                            psVar11 = psVar1 + iVar8;
                          }
                          s->img_buffer_end = psVar11;
                          s->img_buffer = psVar2;
                        }
                        if ((uVar22 & 0x7f) != 0) {
                          lVar15 = 0;
                          do {
                            psVar20[lVar15 * 4 + (long)iVar13 * 4] = bVar5;
                            lVar15 = lVar15 + 1;
                          } while ((uVar22 & 0x7f) != (uint)lVar15);
                          iVar13 = iVar13 + (uint)lVar15;
                        }
                      }
                    }
                    else if (s->read_from_callbacks != 0) {
                      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar8 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        uVar22 = 0;
                        psVar11 = psVar2;
                      }
                      else {
                        uVar22 = (uint)*psVar1;
                        psVar11 = psVar1 + iVar8;
                      }
                      s->img_buffer_end = psVar11;
                      s->img_buffer = psVar2;
                      psVar14 = psVar2;
                      goto LAB_0011cfae;
                    }
                  } while (iVar13 < (int)uVar7);
                  lVar12 = lVar12 + 1;
                  psVar20 = psVar20 + 1;
                  uVar17 = uVar10 & 0x7fffffff;
                  psVar11 = local_50;
                  output_00 = local_68;
                } while (lVar12 != 4);
                do {
                  stbi__hdr_convert(output_00,psVar11,req_comp_00);
                  uVar17 = uVar17 - 1;
                  psVar11 = psVar11 + 4;
                  output_00 = output_00 + req_comp_00;
                } while (uVar17 != 0);
                uVar23 = uVar23 + 1;
                local_68 = local_68 + (uVar10 & 0xffffffff) * (long)req_comp_00;
              } while (uVar23 != (uVar9 & 0x7fffffff));
            }
            free(local_50);
            return output;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;


   // Check identifier
   if (strcmp(stbi__hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   // Read data
   hdr_data = (float *) stbi__malloc(height * width * req_comp * sizeof(float));

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) stbi__malloc(width * 4);

         for (k = 0; k < 4; ++k) {
            i = 0;
            while (i < width) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      STBI_FREE(scanline);
   }

   return hdr_data;
}